

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  _List_node_base *p_Var10;
  size_t sVar11;
  QueuePolicy *q_policy;
  int iVar12;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  bool help;
  int iters;
  communicator world;
  code *local_1b38;
  _List_node_base *local_1b30;
  _List_node_base *local_1b28;
  _List_node_base *local_1b20;
  _List_node_base *local_1b18;
  _List_node_base *local_1b10;
  _List_node_base *local_1b08;
  double local_1b00;
  float quantile;
  float sample_frac;
  int max_time;
  int bpr;
  _Any_data local_1ae8;
  code *local_1ad8;
  code *local_1ad0;
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  double local_1aa8;
  string local_1a98;
  BoolVector local_1a78;
  BoolVector local_1a48;
  time_t t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a08;
  ContiguousAssigner static_assigner;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19e8;
  LoadBlock local_19d8;
  SaveBlock local_19b8;
  DestroyBlock local_1998;
  CreateBlock local_1978;
  DynamicAssigner dynamic_assigner;
  Options ops;
  environment env;
  string local_18a8;
  string local_1888;
  string local_1868;
  DivisionsVector local_1848;
  CoordinateVector local_1828;
  communicator local_1808;
  Bounds domain;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  Master master;
  
  decomposer.dim = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&decomposer,&master,1);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  bpr = 4;
  iters = 1;
  max_time = 1;
  sample_frac = 0.5;
  quantile = 0.8;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"help","");
  decomposer._0_8_ =
       &decomposer.domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  std::__cxx11::string::_M_construct<char_const*>((string *)&decomposer,"show help","");
  opts::Option<bool>((opts *)&local_1b08,'h',(string *)&master,&help,(string *)&decomposer);
  p_Var10 = (_List_node_base *)operator_new(0x18);
  p_Var10[1]._M_next = local_1b08;
  local_1b08 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ =
       &domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end;
  std::__cxx11::string::_M_construct<char_const*>((string *)&domain,"bpr","");
  dynamic_assigner.super_Assigner._vptr_Assigner = (_func_int **)&dynamic_assigner.comm_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dynamic_assigner,"number of diy blocks per mpi rank","");
  opts::Option<int>((opts *)&local_1b10,'b',(string *)&domain,&bpr,(string *)&dynamic_assigner);
  p_Var10 = (_List_node_base *)operator_new(0x18);
  p_Var10[1]._M_next = local_1b10;
  local_1b10 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1ac8._0_8_ = local_1ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ac8,"iters","");
  local_1ae8._M_unused._M_object = &local_1ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ae8,"number of iterations","");
  opts::Option<int>((opts *)&local_1b18,'i',(string *)local_1ac8,&iters,(string *)&local_1ae8);
  p_Var10 = (_List_node_base *)operator_new(0x18);
  p_Var10[1]._M_next = local_1b18;
  local_1b18 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  static_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner = (_func_int **)&local_19e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&static_assigner,"max_time","");
  t = (time_t)&local_1a08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&t,"maximum time to compute a block (in seconds)","");
  opts::Option<int>((opts *)&local_1b20,'t',(string *)&static_assigner,&max_time,(string *)&t);
  p_Var10 = (_List_node_base *)operator_new(0x18);
  p_Var10[1]._M_next = local_1b20;
  local_1b20 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1a98._M_dataplus._M_p = (pointer)&local_1a98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a98,"sample_frac","");
  local_1868._M_dataplus._M_p = (pointer)&local_1868.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1868,"fraction of world procs to sample (0.0 - 1.0)","");
  opts::Option<float>((opts *)&local_1b28,'s',&local_1a98,&sample_frac,&local_1868);
  p_Var10 = (_List_node_base *)operator_new(0x18);
  p_Var10[1]._M_next = local_1b28;
  local_1b28 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1888._M_dataplus._M_p = (pointer)&local_1888.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1888,"quantile","");
  local_18a8._M_dataplus._M_p = (pointer)&local_18a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_18a8,"quantile cutoff above which to move blocks (0.0 - 1.0)","");
  opts::Option<float>((opts *)&local_1b30,'q',&local_1888,&quantile,&local_18a8);
  p_Var10 = (_List_node_base *)operator_new(0x18);
  p_Var10[1]._M_next = local_1b30;
  local_1b30 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_1b30 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b30 + 8))();
  }
  local_1b30 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18a8._M_dataplus._M_p != &local_18a8.field_2) {
    operator_delete(local_18a8._M_dataplus._M_p,local_18a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1888._M_dataplus._M_p != &local_1888.field_2) {
    operator_delete(local_1888._M_dataplus._M_p,local_1888.field_2._M_allocated_capacity + 1);
  }
  if (local_1b28 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b28 + 8))();
  }
  local_1b28 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1868._M_dataplus._M_p != &local_1868.field_2) {
    operator_delete(local_1868._M_dataplus._M_p,local_1868.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a98._M_dataplus._M_p != &local_1a98.field_2) {
    operator_delete(local_1a98._M_dataplus._M_p,local_1a98.field_2._M_allocated_capacity + 1);
  }
  if (local_1b20 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b20 + 8))();
  }
  local_1b20 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)t != &local_1a08) {
    operator_delete((void *)t,local_1a08._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)static_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner != &local_19e8) {
    operator_delete(static_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner,
                    local_19e8._M_allocated_capacity + 1);
  }
  if (local_1b18 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b18 + 8))();
  }
  local_1b18 = (_List_node_base *)0x0;
  if ((code **)local_1ae8._M_unused._0_8_ != &local_1ad8) {
    operator_delete(local_1ae8._M_unused._M_object,(ulong)(local_1ad8 + 1));
  }
  if ((undefined1 *)local_1ac8._0_8_ != local_1ab8) {
    operator_delete((void *)local_1ac8._0_8_,(ulong)(local_1ab8._0_8_ + 1));
  }
  if (local_1b10 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b10 + 8))();
  }
  local_1b10 = (_List_node_base *)0x0;
  if ((communicator *)dynamic_assigner.super_Assigner._vptr_Assigner != &dynamic_assigner.comm_) {
    operator_delete(dynamic_assigner.super_Assigner._vptr_Assigner,
                    (ulong)(dynamic_assigner.comm_.comm_.data + 1));
  }
  if ((pointer *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ !=
      &domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end) {
    operator_delete((void *)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_
                    ,(long)domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end
                     + 1);
  }
  if (local_1b08 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_1b08 + 8))();
  }
  local_1b08 = (_List_node_base *)0x0;
  if ((pointer *)decomposer._0_8_ !=
      &decomposer.domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin) {
    operator_delete((void *)decomposer._0_8_,
                    (long)decomposer.domain.min.
                          super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin + 1);
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar8 = opts::Options::parse(&ops,argc,argv);
  if ((bVar8) && (help != true)) {
    iVar12 = bpr * world.size_;
    static_assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    static_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014b210;
    static_assigner.super_StaticAssigner.super_Assigner.nblocks_ = iVar12;
    diy::Bounds<int>::Bounds(&domain,3);
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0;
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0xff;
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0xff;
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0xff;
    if (world.rank_ == 0) {
      t = time((time_t *)0x0);
    }
    MPI_Bcast(&t,1,&ompi_mpi_long,0,world.comm_.data);
    srand(world.rank_ + (int)t);
    local_1808.comm_.data = world.comm_.data;
    local_1808.rank_ = world.rank_;
    local_1808.size_ = world.size_;
    local_1808.owner_ = false;
    local_1978.super__Function_base._M_functor._8_8_ = 0;
    local_1978.super__Function_base._M_functor._M_unused._M_object = Block::create;
    local_1978._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_1978.super__Function_base._M_manager =
         std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_1998.super__Function_base._M_functor._8_8_ = 0;
    local_1998.super__Function_base._M_functor._M_unused._M_object = Block::destroy;
    local_1998._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_1998.super__Function_base._M_manager =
         std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_19b8.super__Function_base._M_functor._8_8_ = 0;
    local_19b8.super__Function_base._M_functor._M_unused._M_object = Block::save;
    local_19b8._M_invoker =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_19b8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    local_19d8.super__Function_base._M_functor._8_8_ = 0;
    local_19d8.super__Function_base._M_functor._M_unused._M_object = Block::load;
    local_19d8._M_invoker =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_19d8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    q_policy = (QueuePolicy *)operator_new(0x10);
    q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0014b2c8;
    q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
    diy::Master::Master(&master,&local_1808,1,-1,&local_1978,&local_1998,(ExternalStorage *)0x0,
                        &local_19b8,&local_19d8,q_policy);
    if (local_19d8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_19d8.super__Function_base._M_manager)
                ((_Any_data *)&local_19d8,(_Any_data *)&local_19d8,__destroy_functor);
    }
    if (local_19b8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_19b8.super__Function_base._M_manager)
                ((_Any_data *)&local_19b8,(_Any_data *)&local_19b8,__destroy_functor);
    }
    if (local_1998.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1998.super__Function_base._M_manager)
                ((_Any_data *)&local_1998,(_Any_data *)&local_1998,__destroy_functor);
    }
    if (local_1978.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1978.super__Function_base._M_manager)
                ((_Any_data *)&local_1978,(_Any_data *)&local_1978,__destroy_functor);
    }
    diy::mpi::communicator::~communicator(&local_1808);
    local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 0;
    local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._8_8_ = 0;
    local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 0;
    local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._8_8_ = 0;
    local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_1828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1848.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1848.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1848.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    diy::RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
              (&decomposer,3,&domain,iVar12,&local_1a48,&local_1a78,&local_1828,&local_1848);
    if (local_1848.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1848.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1848.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1848.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1828.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1828.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1828.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1828.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ =
           local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1a78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._8_8_ =
           local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_1a48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    dynamic_assigner.super_Assigner.size_ = 0;
    dynamic_assigner.super_Assigner.nblocks_ = 0;
    dynamic_assigner.comm_._8_8_ =
         std::
         _Function_handler<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:81:26)>
         ::_M_invoke;
    dynamic_assigner.comm_.comm_.data =
         (MPI_Comm)
         std::
         _Function_handler<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:81:26)>
         ::_M_manager;
    dynamic_assigner.super_Assigner._vptr_Assigner = (_func_int **)&master;
    diy::RegularDecomposer<diy::Bounds<int>_>::decompose
              (&decomposer,world.rank_,&static_assigner.super_StaticAssigner,
               (Creator *)&dynamic_assigner);
    if (dynamic_assigner.comm_.comm_.data != (MPI_Comm)0x0) {
      (*(code *)dynamic_assigner.comm_.comm_.data)(&dynamic_assigner,&dynamic_assigner,3);
    }
    if (world.rank_ == 0) {
      dynamic_assigner.super_Assigner._vptr_Assigner = (_func_int **)0x0;
      format_str.size_ = 0x1f;
      format_str.data_ = "Summary stats before beginning\n";
      auVar6._8_8_ = 0;
      auVar6._0_8_ = &dynamic_assigner;
      fmt::v7::vprint(_stderr,format_str,(format_args)(auVar6 << 0x40));
    }
    summary_stats(&master);
    MPI_Barrier(world.comm_.data);
    dVar1 = (double)MPI_Wtime();
    dVar2 = (double)MPI_Wtime();
    diy::DynamicAssigner::DynamicAssigner(&dynamic_assigner,&world,world.size_,iVar12);
    diy::record_local_gids(&master,&dynamic_assigner);
    MPI_Barrier(world.comm_.data);
    local_1b00 = (double)MPI_Wtime();
    MPI_Barrier(world.comm_.data);
    local_1b00 = (local_1b00 - dVar2) + 0.0;
    local_1a98._M_dataplus._M_p = local_1a98._M_dataplus._M_p & 0xffffffff00000000;
    if (iters < 1) {
      local_1b38 = (code *)0x0;
    }
    else {
      local_1b38 = (code *)0x0;
      uVar9 = 0;
      do {
        if (world.rank_ == 0) {
          local_1ac8._0_8_ = ZEXT48(uVar9);
          format_str_00.size_ = 0xd;
          format_str_00.data_ = "iteration {}\n";
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)local_1ac8;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = 1;
          fmt::v7::vprint(_stderr,format_str_00,args);
        }
        MPI_Barrier(world.comm_.data);
        dVar2 = (double)MPI_Wtime();
        local_1ae8._M_unused._M_object = (code **)0x0;
        local_1ae8._8_8_ = 0;
        local_1ad0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                     ::_M_invoke;
        local_1ad8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                     ::_M_manager;
        local_1ac8._0_8_ = &max_time;
        local_1ac8._8_8_ = &local_1a98;
        local_1ab8._8_8_ =
             std::
             _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:138:24)>
             ::_M_invoke;
        local_1ab8._0_8_ =
             std::
             _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/load_balancing/sampling.cpp:138:24)>
             ::_M_manager;
        diy::Master::foreach_<Block>(&master,(Callback<Block> *)local_1ac8,(Skip *)&local_1ae8);
        if ((code *)local_1ab8._0_8_ != (code *)0x0) {
          (*(code *)local_1ab8._0_8_)
                    ((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)local_1ac8,
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)local_1ac8,3);
        }
        if (local_1ad8 != (code *)0x0) {
          (*local_1ad8)(&local_1ae8,&local_1ae8,3);
        }
        MPI_Barrier(world.comm_.data);
        dVar3 = (double)MPI_Wtime();
        dVar4 = (double)MPI_Wtime();
        local_1ac8._0_8_ = get_block_work;
        diy::load_balance_sampling<unsigned_int(*)(Block*,int)>
                  (&master,&dynamic_assigner,(_func_uint_Block_ptr_int **)local_1ac8,sample_frac,
                   quantile);
        MPI_Barrier(world.comm_.data);
        dVar5 = (double)MPI_Wtime();
        local_1b38 = (code *)((double)local_1b38 + (dVar3 - dVar2));
        local_1b00 = local_1b00 + (dVar5 - dVar4);
        uVar9 = (uint)local_1a98._M_dataplus._M_p + 1;
        local_1a98._M_dataplus._M_p._0_4_ = uVar9;
      } while ((int)uVar9 < iters);
    }
    MPI_Barrier(world.comm_.data);
    dVar2 = (double)MPI_Wtime();
    if (world.rank_ == 0) {
      local_1ac8._0_8_ = dVar2 - dVar1;
      local_1ab8._0_8_ = local_1b38;
      local_1aa8 = local_1b00;
      format_str_01.size_ = 0x55;
      format_str_01.data_ =
           "Total elapsed wall time {:.4} s = computation time {:.4} s + balancing time {:.4} s.\n";
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_1ac8;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0xaaa;
      fmt::v7::vprint(_stderr,format_str_01,args_00);
    }
    if (world.rank_ == 0) {
      local_1ac8._0_8_ = (code **)0x0;
      format_str_02.size_ = 0x1e;
      format_str_02.data_ = "Summary stats upon completion\n";
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1ac8;
      fmt::v7::vprint(_stderr,format_str_02,(format_args)(auVar7 << 0x40));
    }
    summary_stats(&master);
    diy::DynamicAssigner::~DynamicAssigner(&dynamic_assigner);
    diy::RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(&decomposer);
    diy::Master::~Master(&master);
    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
         domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
        (pointer)0x0) {
      operator_delete(domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_data,
                      domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_capacity << 2);
    }
    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
         domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
        (pointer)0x0) {
      operator_delete(domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_data,
                      domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                      m_dynamic_capacity << 2);
    }
    iVar12 = 0;
  }
  else {
    iVar12 = 1;
    if (world.rank_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
      __s = *argv;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d288);
      }
      else {
        sVar11 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [OPTIONS]\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Tests work stealing\n",0x14);
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&ops.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ops);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return iVar12;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);                          // diy equivalent of MPI_Init
    diy::mpi::communicator    world;                                    // diy equivalent of MPI communicator
    int                       bpr = 4;                                  // blocks per rank
    int                       iters = 1;                                // number of iterations to run
    int                       max_time = 1;                             // maximum time to compute a block (sec.)
    float                     sample_frac = 0.5f;                       // fraction of world procs to sample (0.0 - 1.0)
    float                     quantile = 0.8f;                          // quantile cutoff above which to move blocks (0.0 - 1.0)
    double                    wall_time;                                // wall clock execution time for entire code
    double                    comp_time = 0.0;                          // total computation time (sec.)
    double                    balance_time = 0.0;                       // total load balancing time (sec.)
    double                    t0;                                       // starting time (sec.)
    bool                      help;

    using namespace opts;
    Options ops;
    ops
        >> Option('h', "help",          help,           "show help")
        >> Option('b', "bpr",           bpr,            "number of diy blocks per mpi rank")
        >> Option('i', "iters",         iters,          "number of iterations")
        >> Option('t', "max_time",      max_time,       "maximum time to compute a block (in seconds)")
        >> Option('s', "sample_frac",   sample_frac,    "fraction of world procs to sample (0.0 - 1.0)")
        >> Option('q', "quantile",      quantile,       "quantile cutoff above which to move blocks (0.0 - 1.0)")
        ;

    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Tests work stealing\n";
            std::cout << ops;
        }
        return 1;
    }

//     diy::create_logger("trace");

    int                       nblocks = world.size() * bpr;             // total number of blocks in global domain
    diy::ContiguousAssigner   static_assigner(world.size(), nblocks);

    Bounds domain(3);                                                   // global data size
    domain.min[0] = domain.min[1] = domain.min[2] = 0;
    domain.max[0] = domain.max[1] = domain.max[2] = 255;

    // seed random number generator for user code, broadcast seed, offset by rank
    time_t t;
    if (world.rank() == 0)
        t = time(0);
    diy::mpi::broadcast(world, t, 0);
    srand(t + world.rank());

    // create master for managing blocks in this process
    diy::Master master(world,
                       1,                                               // one thread
                       -1,                                              // all blocks in memory
                       &Block::create,
                       &Block::destroy,
                       0,
                       &Block::save,
                       &Block::load);

    // create a regular decomposer and call its decompose function
    diy::RegularDecomposer<Bounds> decomposer(3,
                                              domain,
                                              nblocks);
    decomposer.decompose(world.rank(), static_assigner,
                         [&](int gid,                                   // block global id
                             const Bounds&,                             // core block bounds without any ghost added (unused)
                             const Bounds& bounds,                      // block bounds including ghost region
                             const Bounds&,                             // global domain bounds (unused)
                             const RGLink& link)                        // neighborhood
                         {
                             Block*     b   = new Block;
                             RGLink*    l   = new RGLink(link);
                             b->gid         = gid;

                             b->bounds      = bounds;
                             // TODO: comment out the following line for actual random work
                             // generation, leave uncommented for reproducible work generation
                             std::srand(gid + 1);

                             b->work        = static_cast<diy::Work>(double(std::rand()) / RAND_MAX * WORK_MAX);
                             master.add(gid, b, l);
                         });

    // collect summary stats before beginning
    if (world.rank() == 0)
        fmt::print(stderr, "Summary stats before beginning\n");
    summary_stats(master);

    // timing
    world.barrier();                                                    // barrier to synchronize clocks across procs, do not remove
    wall_time = MPI_Wtime();
    t0 = MPI_Wtime();

    // copy dynamic assigner from master
    diy::DynamicAssigner    dynamic_assigner(world, world.size(), nblocks);
    diy::record_local_gids(master, dynamic_assigner);

    // timing
    world.barrier();
    balance_time += (MPI_Wtime() - t0);

    // this barrier is mandatory, do not remove
    // dynamic assigner needs to be fully updated and sync'ed across all procs before proceeding
    world.barrier();

    // debug: print each block
//     master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
//             { b->show_block(cp); });

    // perform some iterative algorithm
    for (auto n = 0; n < iters; n++)
    {
        // debug
        if (world.rank() == 0)
            fmt::print(stderr, "iteration {}\n", n);

        // timing
        world.barrier();
        t0 = MPI_Wtime();

        // some block computation
        master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
                { b->compute(cp, max_time, n); });

        // timing
        world.barrier();
        comp_time += (MPI_Wtime() - t0);
        t0 = MPI_Wtime();

        // sampling load balancing method
        diy::load_balance_sampling(master, dynamic_assigner, &get_block_work, sample_frac, quantile);

        // timing
        world.barrier();
        balance_time += (MPI_Wtime() - t0);
    }

    // debug: print the master
//     for (auto i = 0; i < master.size(); i++)
//         fmt::print(stderr, "lid {} gid {}\n", i, master.gid(i));

    world.barrier();                                    // barrier to synchronize clocks over procs, do not remove
    wall_time = MPI_Wtime() - wall_time;
    if (world.rank() == 0)
    if (world.rank() == 0)
        fmt::print(stderr, "Total elapsed wall time {:.4} s = computation time {:.4} s + balancing time {:.4} s.\n",
                wall_time, comp_time, balance_time);

    // load balance summary stats
    if (world.rank() == 0)
        fmt::print(stderr, "Summary stats upon completion\n");
    summary_stats(master);
}